

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

int unsignedIntToString(char *destination,size_t destinationSize,uint value)

{
  char cVar1;
  size_t sVar2;
  bool local_32;
  ulong uStack_30;
  char temp;
  size_t w;
  size_t pos;
  int result;
  uint value_local;
  size_t destinationSize_local;
  char *destination_local;
  
  if ((destination == (char *)0x0) || (destinationSize < 2)) {
    pos._0_4_ = 0x2fb;
  }
  else {
    w = 0;
    sVar2 = w;
    pos._4_4_ = value;
    do {
      w = sVar2;
      sVar2 = w + 1;
      destination[w] = (char)(pos._4_4_ % 10) + '0';
      pos._4_4_ = pos._4_4_ / 10;
      local_32 = pos._4_4_ != 0 && sVar2 < destinationSize - 1;
    } while (local_32);
    if (pos._4_4_ == 0) {
      destination[sVar2] = '\0';
      for (uStack_30 = 0; uStack_30 <= w >> 1; uStack_30 = uStack_30 + 1) {
        cVar1 = destination[uStack_30];
        destination[uStack_30] = destination[w - uStack_30];
        destination[w - uStack_30] = cVar1;
      }
      pos._0_4_ = 0;
    }
    else {
      pos._0_4_ = 0x318;
    }
  }
  return (int)pos;
}

Assistant:

int unsignedIntToString(char* destination, size_t destinationSize, unsigned int value)
{
    int result;
    size_t pos;
    /*the below loop gets the number in reverse order*/
    /*Codes_SRS_CRT_ABSTRACTIONS_02_003: [If destination is NULL then unsignedIntToString shall fail.] */
    /*Codes_SRS_CRT_ABSTRACTIONS_02_002: [If the conversion fails for any reason (for example, insufficient buffer space), a non-zero return value shall be supplied and unsignedIntToString shall fail.] */
    if (
        (destination == NULL) ||
        (destinationSize < 2) /*because the smallest number is '0\0' which requires 2 characters*/
        )
    {
        result = MU_FAILURE;
    }
    else
    {
        pos = 0;
        do
        {
            destination[pos++] = '0' + (value % 10);
            value /= 10;
        } while ((value > 0) && (pos < (destinationSize-1)));

        if (value == 0)
        {
            size_t w;
            destination[pos] = '\0';
            /*all converted and they fit*/
            for (w = 0; w <= (pos-1) >> 1; w++)
            {
                char temp;
                temp = destination[w];
                destination[w] = destination[pos - 1 - w];
                destination[pos -1 - w] = temp;
            }
            /*Codes_SRS_CRT_ABSTRACTIONS_02_004: [If the conversion has been successfull then unsignedIntToString shall return 0.] */
            result = 0;
        }
        else
        {
            /*Codes_SRS_CRT_ABSTRACTIONS_02_002: [If the conversion fails for any reason (for example, insufficient buffer space), a non-zero return value shall be supplied and unsignedIntToString shall fail.] */
            result = MU_FAILURE;
        }
    }
    return result;
}